

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField32.c
# Opt level: O1

void Hacl_GenericField32_exp_vartime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,uint32_t *aM,uint32_t bBits,
               uint32_t *b,uint32_t *resM)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  size_t __n;
  size_t sVar3;
  long lVar4;
  uint32_t *__n_00;
  uint uVar5;
  int iVar6;
  byte bVar7;
  sbyte sVar8;
  undefined4 in_register_00000014;
  ulong uVar9;
  ulong uVar10;
  uint32_t *puVar11;
  ulong uVar12;
  uint32_t *puVar13;
  uint32_t uVar14;
  uint uVar15;
  uint32_t uVar16;
  uint uVar17;
  uint32_t *puVar18;
  uint32_t auStack_e0 [2];
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  uint32_t *local_c0;
  uint32_t *t11_3;
  uint32_t *t11_2;
  uint32_t *t11_1;
  uint32_t *local_a0;
  uint32_t *ctx_r2;
  ulong local_90;
  ulong local_88;
  uint32_t *local_80;
  uint32_t *t11;
  uint local_6c;
  uint32_t *local_68;
  uint32_t *ctx_n;
  ulong local_58;
  uint32_t *local_50;
  uint32_t *local_48;
  uint32_t *local_40;
  uint32_t *ctx_n0;
  
  local_90 = CONCAT44(in_register_00000014,bBits);
  uVar17 = k->len;
  uVar9 = (ulong)uVar17;
  local_50 = k->n;
  ctx_n0._4_4_ = k->mu;
  local_40 = k->r2;
  uVar10 = uVar9 * 4 + 0xf & 0xfffffffffffffff0;
  lVar4 = -uVar10;
  puVar11 = (uint32_t *)((long)&local_d8 + lVar4);
  __n = uVar9 * 4;
  ctx_r2 = b;
  ctx_n = resM;
  *(undefined8 *)((long)auStack_e0 + lVar4) = 0x142b85;
  memset(puVar11,0,__n);
  local_48 = puVar11;
  *(undefined8 *)((long)auStack_e0 + lVar4) = 0x142b97;
  memcpy(puVar11,aM,__n);
  if ((uint)local_90 < 200) {
    puVar11 = (uint32_t *)((long)puVar11 - ((ulong)(uVar17 * 2) * 4 + 0xf & 0xfffffffffffffff0));
    uVar15 = 0;
    puVar11[-2] = 0x142bd7;
    puVar11[-1] = 0;
    memset(puVar11,0,(ulong)(uVar17 * 2) << 2);
    puVar1 = local_50;
    puVar11[-2] = 0x142be6;
    puVar11[-1] = 0;
    memcpy(puVar11,puVar1,__n);
    puVar1 = local_40;
    puVar11[-2] = 0x142bf9;
    puVar11[-1] = 0;
    memcpy(puVar11 + uVar9,puVar1,__n);
    uVar14 = ctx_n0._4_4_;
    puVar1 = ctx_n;
    local_40 = puVar11;
    puVar11[-2] = 0x142c14;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar17,puVar11,uVar14,puVar11 + uVar9,puVar1);
    puVar1 = local_40;
    uVar5 = (uint)local_90;
    if (uVar5 != 0) {
      do {
        puVar13 = local_48;
        puVar2 = ctx_n;
        if ((ctx_r2[uVar15 >> 5] >> (uVar15 & 0x1f) & 1) != 0) {
          puVar11[-2] = 0x142c5f;
          puVar11[-1] = 0;
          Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar1,uVar14,puVar2,puVar13,puVar2);
        }
        puVar2 = local_48;
        puVar11[-2] = 0x142c73;
        puVar11[-1] = 0;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar1,uVar14,puVar2,puVar2);
        uVar15 = uVar15 + 1;
      } while (uVar5 != uVar15);
    }
  }
  else {
    local_6c = (uint)local_90 - 1 >> 5;
    local_58 = (ulong)(uVar17 * 2);
    puVar11 = (uint32_t *)((long)puVar11 - (local_58 * 4 + 0xf & 0xfffffffffffffff0));
    sVar3 = local_58 * 4;
    local_68 = puVar11;
    puVar11[-2] = 0x142cbf;
    puVar11[-1] = 0;
    memset(puVar11,0,sVar3);
    puVar1 = local_50;
    puVar11[-2] = 0x142cce;
    puVar11[-1] = 0;
    memcpy(puVar11,puVar1,__n);
    puVar1 = local_40;
    local_a0 = puVar11 + uVar9;
    puVar11[-2] = 0x142ce5;
    puVar11[-1] = 0;
    memcpy(puVar11 + uVar9,puVar1,__n);
    local_d8 = (ulong)(uVar17 << 4);
    sVar3 = local_d8 * 4;
    puVar11 = puVar11 + -local_d8;
    puVar11[-2] = 0x142d10;
    puVar11[-1] = 0;
    memset(puVar11,0,sVar3);
    puVar18 = (uint32_t *)((long)puVar11 - uVar10);
    local_88 = uVar10;
    puVar18[-2] = 0x142d2a;
    puVar18[-1] = 0;
    memset(puVar18,0,__n);
    uVar14 = ctx_n0._4_4_;
    puVar2 = local_68;
    puVar1 = local_a0;
    local_50 = puVar11;
    local_40 = (uint32_t *)__n;
    puVar18[-2] = 0x142d55;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar17,puVar2,uVar14,puVar1,puVar11);
    puVar13 = local_40;
    puVar1 = local_48;
    puVar18[-2] = 0x142d65;
    puVar18[-1] = 0;
    memcpy(puVar11 + uVar9,puVar1,(size_t)puVar13);
    uVar14 = ctx_n0._4_4_;
    puVar18[-2] = 0x142d7d;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar2,uVar14,puVar11 + uVar9,puVar18);
    puVar1 = local_40;
    puVar11 = puVar11 + local_58;
    puVar18[-2] = 0x142d9b;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar1);
    puVar1 = local_48;
    puVar2 = local_68;
    puVar18[-2] = 0x142db7;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar2,uVar14,puVar1,puVar11,puVar18);
    puVar13 = local_40;
    local_d0 = (ulong)(uVar17 * 3);
    puVar1 = local_50 + local_d0;
    local_80 = puVar1;
    puVar18[-2] = 0x142dda;
    puVar18[-1] = 0;
    memcpy(puVar1,puVar18,(size_t)puVar13);
    puVar18[-2] = 0x142dee;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar2,uVar14,puVar11,puVar18);
    puVar1 = local_40;
    local_c8 = (ulong)(uVar17 * 4);
    puVar11 = local_50 + local_c8;
    t11_2 = puVar11;
    puVar18[-2] = 0x142e1b;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar1);
    uVar14 = ctx_n0._4_4_;
    puVar1 = local_48;
    puVar18[-2] = 0x142e3a;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar2,uVar14,puVar1,puVar11,puVar18);
    puVar13 = local_40;
    puVar1 = local_50;
    t11 = (uint32_t *)(ulong)(uVar17 * 5);
    puVar11 = local_50 + (long)t11;
    t11_3 = puVar11;
    puVar18[-2] = 0x142e5d;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar13);
    puVar11 = local_80;
    puVar18[-2] = 0x142e72;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar2,uVar14,puVar11,puVar18);
    puVar11 = local_40;
    puVar1 = puVar1 + (uint)((int)local_58 * 3);
    local_c0 = puVar1;
    puVar18[-2] = 0x142e93;
    puVar18[-1] = 0;
    memcpy(puVar1,puVar18,(size_t)puVar11);
    uVar14 = ctx_n0._4_4_;
    puVar11 = local_48;
    puVar18[-2] = 0x142ead;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar2,uVar14,puVar11,puVar1,puVar18);
    puVar11 = local_40;
    puVar1 = local_50;
    t11_1 = (uint32_t *)(ulong)(uVar17 * 8);
    puVar13 = local_50 + uVar17 * 7;
    local_80 = puVar13;
    puVar18[-2] = 0x142ede;
    puVar18[-1] = 0;
    memcpy(puVar13,puVar18,(size_t)puVar11);
    puVar11 = t11_2;
    puVar18[-2] = 0x142ef5;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar2,uVar14,puVar11,puVar18);
    puVar13 = local_40;
    puVar11 = puVar1 + (long)t11_1;
    puVar18[-2] = 0x142f13;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar13);
    uVar14 = ctx_n0._4_4_;
    puVar13 = local_48;
    puVar18[-2] = 0x142f2b;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar2,uVar14,puVar13,puVar11,puVar18);
    puVar11 = local_40;
    puVar18[-2] = 0x142f3f;
    puVar18[-1] = 0;
    memcpy(puVar1 + uVar17 * 9,puVar18,(size_t)puVar11);
    uVar14 = ctx_n0._4_4_;
    puVar11 = t11_3;
    puVar18[-2] = 0x142f57;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar2,uVar14,puVar11,puVar18);
    puVar11 = local_40;
    iVar6 = (int)local_58;
    puVar18[-2] = 0x142f71;
    puVar18[-1] = 0;
    memcpy(puVar1 + (uint)(iVar6 * 5),puVar18,(size_t)puVar11);
    uVar14 = ctx_n0._4_4_;
    puVar11 = local_48;
    puVar18[-2] = 0x142f8d;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32
              (uVar17,puVar2,uVar14,puVar11,puVar1 + (uint)(iVar6 * 5),puVar18);
    puVar11 = local_40;
    iVar6 = (int)t11;
    puVar18[-2] = 0x142fa5;
    puVar18[-1] = 0;
    memcpy(puVar1 + (uVar17 + iVar6 * 2),puVar18,(size_t)puVar11);
    puVar1 = local_68;
    puVar11 = local_c0;
    puVar18[-2] = 0x142fc1;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar1,uVar14,puVar11,puVar18);
    puVar1 = local_40;
    puVar11 = local_50 + (uint)((int)local_c8 * 3);
    puVar18[-2] = 0x142fe2;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar1);
    puVar2 = local_48;
    puVar1 = local_68;
    puVar18[-2] = 0x142ffd;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar1,uVar14,puVar2,puVar11,puVar18);
    puVar13 = local_40;
    puVar2 = local_50;
    puVar11 = local_50 + (uVar17 + (int)local_d0 * 4);
    puVar18[-2] = 0x14301c;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar13);
    uVar14 = ctx_n0._4_4_;
    puVar11 = local_80;
    puVar18[-2] = 0x143031;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar17,puVar1,uVar14,puVar11,puVar18);
    puVar13 = local_40;
    puVar11 = puVar2 + (uint)((int)local_d8 - (int)local_58);
    puVar18[-2] = 0x14304e;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar13);
    uVar14 = ctx_n0._4_4_;
    __n_00 = local_40;
    puVar13 = local_48;
    puVar18[-2] = 0x14306a;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar17,puVar1,uVar14,puVar13,puVar11,puVar18);
    uVar10 = local_90;
    iVar6 = (int)t11;
    puVar18[-2] = 0x143087;
    puVar18[-1] = 0;
    memcpy(puVar2 + (uint)(iVar6 * 3),puVar18,(size_t)__n_00);
    uVar14 = ctx_n0._4_4_;
    puVar2 = ctx_n;
    uVar12 = local_88;
    puVar11 = local_a0;
    local_58 = uVar9;
    if ((uVar10 & 3) == 0) {
      puVar18[-2] = 0x143107;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar17,puVar1,uVar14,puVar11,puVar2);
      uVar12 = local_88;
    }
    else {
      uVar9 = uVar10 >> 5 & 0x7ffffff;
      bVar7 = (byte)uVar10 & 0x1c;
      uVar5 = ctx_r2[uVar9] >> bVar7;
      if ((uVar10 & 0x1c) != 0 && (uint)uVar9 < local_6c) {
        uVar5 = ctx_r2[uVar9 + 1] << (-bVar7 & 0x1f) | uVar5;
      }
      puVar11 = local_50 + (uVar5 & 0xf) * uVar17;
      puVar18[-2] = 0x1430ef;
      puVar18[-1] = 0;
      memcpy(puVar2,puVar11,(size_t)__n_00);
    }
    puVar18 = (uint32_t *)((long)puVar18 - uVar12);
    t11 = puVar18;
    puVar18[-2] = 0x143125;
    puVar18[-1] = 0;
    memset(puVar18,0,(size_t)__n_00);
    uVar17 = (uint)uVar10 & 0xfffffffc;
    iVar6 = ((uint)(uVar10 >> 2) & 0x3fffffff) + (uint)((uVar10 >> 2 & 0x3fffffff) == 0);
    puVar11 = local_68;
    uVar10 = local_58;
    uVar14 = ctx_n0._4_4_;
    do {
      puVar1 = ctx_n;
      uVar17 = uVar17 - 4;
      local_48 = (uint32_t *)CONCAT44(local_48._4_4_,iVar6);
      uVar16 = (uint32_t)uVar10;
      puVar18[-2] = 0x143160;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar16,puVar11,uVar14,puVar1,puVar1);
      puVar18[-2] = 0x143174;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar16,puVar11,uVar14,puVar1,puVar1);
      puVar18[-2] = 0x143188;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar16,puVar11,uVar14,puVar1,puVar1);
      puVar18[-2] = 0x14319c;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar16,puVar11,uVar14,puVar1,puVar1);
      puVar11 = local_40;
      uVar10 = local_58;
      puVar1 = t11;
      uVar15 = uVar17 >> 5;
      sVar8 = (sbyte)(uVar17 & 0x1c);
      uVar5 = ctx_r2[uVar15] >> sVar8;
      if ((uVar17 & 0x1c) != 0 && uVar15 < local_6c) {
        uVar5 = ctx_r2[(ulong)uVar15 + 1] << (-sVar8 & 0x1fU) | uVar5;
      }
      uVar16 = (uint32_t)local_58;
      puVar2 = local_50 + (uVar5 & 0xf) * uVar16;
      puVar18[-2] = 0x1431f9;
      puVar18[-1] = 0;
      memcpy(puVar1,puVar2,(size_t)puVar11);
      uVar14 = ctx_n0._4_4_;
      puVar2 = ctx_n;
      puVar11 = local_68;
      puVar18[-2] = 0x143219;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar16,puVar11,uVar14,puVar2,puVar1,puVar2);
      iVar6 = (int)local_48 + -1;
    } while (iVar6 != 0);
  }
  return;
}

Assistant:

void
Hacl_GenericField32_exp_vartime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,
  uint32_t *aM,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *resM
)
{
  uint32_t len1 = Hacl_GenericField32_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint32_t), k1.len);
  uint32_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint32_t));
  memcpy(aMc, aM, k1.len * sizeof (uint32_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i = 0U; i < bBits; i++)
    {
      uint32_t i1 = i / 32U;
      uint32_t j = i % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      if (!(bit == 0U))
      {
        uint32_t *ctx_n0 = ctx;
        Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n0, k1.mu, resM, aMc, resM);
      }
      uint32_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n0, k1.mu, aMc, aMc);
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 32U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), 16U * len1);
    uint32_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint32_t));
    uint32_t *t0 = table;
    uint32_t *t1 = table + len1;
    uint32_t *ctx_n0 = ctx;
    uint32_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint32_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint32_t *t11 = table + (i + 1U) * len1;
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint32_t));
      uint32_t *t2 = table + (2U * i + 2U) * len1;
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint32_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i = bBits / 4U * 4U;
      uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i, 4U);
      uint32_t bits_l32 = bits_c;
      const uint32_t *a_bits_l = table + bits_l32 * len1;
      memcpy(resM, (uint32_t *)a_bits_l, len1 * sizeof (uint32_t));
    }
    else
    {
      uint32_t *ctx_n = ctx;
      uint32_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint32_t));
    for (uint32_t i = 0U; i < bBits / 4U; i++)
    {
      KRML_MAYBE_FOR4(i0,
        0U,
        4U,
        1U,
        uint32_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i - 4U;
      uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k2, 4U);
      uint32_t bits_l32 = bits_l;
      const uint32_t *a_bits_l = table + bits_l32 * len1;
      memcpy(tmp0, (uint32_t *)a_bits_l, len1 * sizeof (uint32_t));
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}